

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

int Curl_num_addresses(Curl_addrinfo *addr)

{
  int local_14;
  Curl_addrinfo *pCStack_10;
  int i;
  Curl_addrinfo *addr_local;
  
  local_14 = 0;
  for (pCStack_10 = addr; pCStack_10 != (Curl_addrinfo *)0x0; pCStack_10 = pCStack_10->ai_next) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int Curl_num_addresses(const Curl_addrinfo *addr)
{
  int i = 0;
  while(addr) {
    addr = addr->ai_next;
    i++;
  }
  return i;
}